

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void Scope::RemoveParamScope(ParseNodeFnc *pnodeScope)

{
  Scope *pSVar1;
  Scope *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (pnodeScope->funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                       ,0x78,"(pnodeScope->funcInfo)","pnodeScope->funcInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = pnodeScope->pnodeScopes->scope;
  this = pnodeScope->pnodeBodyScope->scope;
  *(ushort *)&pSVar1->field_0x44 = *(ushort *)&pSVar1->field_0x44 & 0xffef;
  pSVar1->m_count = 0;
  pSVar1->scopeSlotCount = 0;
  pSVar1->m_symList = (Symbol *)0x0;
  SetEnclosingScope(this,pSVar1->enclosingScope);
  return;
}

Assistant:

void Scope::RemoveParamScope(ParseNodeFnc *pnodeScope)
{
    Assert(pnodeScope->funcInfo);
    Scope *paramScope = pnodeScope->pnodeScopes->scope;
    Scope *bodyScope = pnodeScope->pnodeBodyScope->scope;

    // Once the scopes are merged, there's no reason to instantiate the param scope.
    paramScope->SetMustInstantiate(false);

    paramScope->m_count = 0;
    paramScope->scopeSlotCount = 0;
    paramScope->m_symList = nullptr;
    // Remove the parameter scope from the scope chain.

    bodyScope->SetEnclosingScope(paramScope->GetEnclosingScope());
}